

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadratic.hpp
# Opt level: O1

void __thiscall openjij::test::Graph_JSONTest_Test::TestBody(Graph_JSONTest_Test *this)

{
  pointer puVar1;
  AssertionResult gtest_ar;
  double offset;
  Chimera<double> s;
  Quadratic<uint32_t,_double> quadratic;
  Linear<uint32_t,_double> linear;
  BinaryQuadraticModel<unsigned_int,_double,_cimod::Sparse> bqm_k4;
  char *expr1;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_1c8;
  SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_> in_stack_fffffffffffffe40;
  undefined7 in_stack_fffffffffffffe41;
  json_value in_stack_fffffffffffffe48;
  AssertHelper in_stack_fffffffffffffe50;
  StorageIndex *abs_error_expr;
  Chimera<double> local_1a0;
  _Hashtable<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_128;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_f0;
  BinaryQuadraticModel<unsigned_int,_double,_cimod::Sparse> local_b8;
  
  local_b8._quadmat.m_innerSize = 0xb;
  local_b8._quadmat.m_outerIndex = (StorageIndex *)0x4008000000000000;
  local_b8._quadmat.super_SparseCompressedBase<Eigen::SparseMatrix<double,_1,_int>_>.
  super_SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_>.m_isRValue =
       (SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_>)0x0;
  local_b8._quadmat._1_7_ = 0;
  local_b8._quadmat.m_outerSize = 0x3ff0000000000000;
  std::
  _Hashtable<unsigned_int,std::pair<unsigned_int_const,double>,std::allocator<std::pair<unsigned_int_const,double>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_Hashtable<std::pair<unsigned_int_const,double>const*>
            ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,double>,std::allocator<std::pair<unsigned_int_const,double>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&local_f0,&local_b8,&local_b8._quadmat.m_innerNonZeros,0,&local_1a0,&local_128,
             &stack0xfffffffffffffe40);
  local_b8._quadmat.super_SparseCompressedBase<Eigen::SparseMatrix<double,_1,_int>_>.
  super_SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_>.m_isRValue =
       (SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_>)0x0;
  local_b8._quadmat._1_7_ = 0x4000000;
  local_b8._quadmat.m_outerSize = 0x4028000000000000;
  local_b8._quadmat.m_innerSize = 0xc00000004;
  local_b8._quadmat.m_outerIndex = (StorageIndex *)0x402a000000000000;
  local_b8._quadmat.m_innerNonZeros = (StorageIndex *)0xe00000006;
  local_b8._quadmat.m_data.m_values = (Scalar *)0x402c000000000000;
  local_b8._quadmat.m_data.m_indices = (StorageIndex *)0x400000003;
  local_b8._quadmat.m_data.m_size = 0x4037000000000000;
  local_b8._quadmat.m_data.m_allocatedSize = 0xc0000000b;
  local_b8._idx_to_label.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x4038000000000000;
  local_b8._idx_to_label.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0xd00000005;
  local_b8._idx_to_label.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x4041000000000000;
  expr1 = &stack0xfffffffffffffe58;
  std::
  _Hashtable<std::pair<unsigned_int,unsigned_int>,std::pair<std::pair<unsigned_int,unsigned_int>const,double>,std::allocator<std::pair<std::pair<unsigned_int,unsigned_int>const,double>>,std::__detail::_Select1st,std::equal_to<std::pair<unsigned_int,unsigned_int>>,cimod::pair_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_Hashtable<std::pair<std::pair<unsigned_int,unsigned_int>const,double>const*>
            ((_Hashtable<std::pair<unsigned_int,unsigned_int>,std::pair<std::pair<unsigned_int,unsigned_int>const,double>,std::allocator<std::pair<std::pair<unsigned_int,unsigned_int>const,double>>,std::__detail::_Select1st,std::equal_to<std::pair<unsigned_int,unsigned_int>>,cimod::pair_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&local_128,&local_b8,&local_b8._label_to_idx,0,&local_1a0,&stack0xfffffffffffffe40);
  abs_error_expr = (StorageIndex *)0x0;
  cimod::BinaryQuadraticModel<unsigned_int,_double,_cimod::Sparse>::BinaryQuadraticModel
            (&local_b8,(Linear<unsigned_int,_double> *)&local_f0,
             (Quadratic<unsigned_int,_double> *)&local_128,(double *)&stack0xfffffffffffffe58,SPIN);
  cimod::BinaryQuadraticModel<unsigned_int,_double,_cimod::Sparse>::to_serializable<cimod::Sparse>
            ((BinaryQuadraticModel<unsigned_int,_double,_cimod::Sparse> *)&stack0xfffffffffffffe40,
             &local_b8);
  graph::Chimera<double>::Chimera(&local_1a0,(json *)&stack0xfffffffffffffe40,1,2,0.0);
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)&stack0xfffffffffffffe40);
  graph::Chimera<double>::J(&local_1a0,0,1,3,IN_0or4);
  testing::internal::DoubleNearPredFormat
            (expr1,(char *)0x13cc9c,(char *)abs_error_expr,(double)in_stack_fffffffffffffe50.data_,
             in_stack_fffffffffffffe48.number_float,
             (double)CONCAT71(in_stack_fffffffffffffe41,in_stack_fffffffffffffe40.m_isRValue));
  if (in_stack_fffffffffffffe40.m_isRValue == false) {
    testing::Message::Message((Message *)&local_1c8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        in_stack_fffffffffffffe48.object ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      puVar1 = "";
    }
    else {
      puVar1 = ((in_stack_fffffffffffffe48.binary)->
               super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffe50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/quadratic.hpp"
               ,0xd4,(char *)puVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffe50,(Message *)&local_1c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffe50);
    if (local_1c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1c8._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      in_stack_fffffffffffffe48.object !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffe48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe48.object);
  }
  graph::Chimera<double>::J(&local_1a0,0,0,4,PLUS_C);
  testing::internal::DoubleNearPredFormat
            (expr1,(char *)0x13cd67,(char *)abs_error_expr,(double)in_stack_fffffffffffffe50.data_,
             in_stack_fffffffffffffe48.number_float,
             (double)CONCAT71(in_stack_fffffffffffffe41,in_stack_fffffffffffffe40.m_isRValue));
  if (in_stack_fffffffffffffe40.m_isRValue == false) {
    testing::Message::Message((Message *)&local_1c8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        in_stack_fffffffffffffe48.object ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      puVar1 = "";
    }
    else {
      puVar1 = ((in_stack_fffffffffffffe48.binary)->
               super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffe50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/quadratic.hpp"
               ,0xd5,(char *)puVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffe50,(Message *)&local_1c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffe50);
    if (local_1c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1c8._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      in_stack_fffffffffffffe48.object !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffe48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe48.object);
  }
  graph::Chimera<double>::J(&local_1a0,0,1,6,MINUS_C);
  testing::internal::DoubleNearPredFormat
            (expr1,(char *)0x13ce35,(char *)abs_error_expr,(double)in_stack_fffffffffffffe50.data_,
             in_stack_fffffffffffffe48.number_float,
             (double)CONCAT71(in_stack_fffffffffffffe41,in_stack_fffffffffffffe40.m_isRValue));
  if (in_stack_fffffffffffffe40.m_isRValue == false) {
    testing::Message::Message((Message *)&local_1c8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        in_stack_fffffffffffffe48.object ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      puVar1 = "";
    }
    else {
      puVar1 = ((in_stack_fffffffffffffe48.binary)->
               super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffe50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/quadratic.hpp"
               ,0xd6,(char *)puVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffe50,(Message *)&local_1c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffe50);
    if (local_1c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1c8._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      in_stack_fffffffffffffe48.object !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffe48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe48.object);
  }
  graph::Chimera<double>::J(&local_1a0,0,0,4,IN_3or7);
  testing::internal::DoubleNearPredFormat
            (expr1,(char *)0x13cf00,(char *)abs_error_expr,(double)in_stack_fffffffffffffe50.data_,
             in_stack_fffffffffffffe48.number_float,
             (double)CONCAT71(in_stack_fffffffffffffe41,in_stack_fffffffffffffe40.m_isRValue));
  if (in_stack_fffffffffffffe40.m_isRValue == false) {
    testing::Message::Message((Message *)&local_1c8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        in_stack_fffffffffffffe48.object ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      puVar1 = "";
    }
    else {
      puVar1 = ((in_stack_fffffffffffffe48.binary)->
               super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffe50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/quadratic.hpp"
               ,0xd7,(char *)puVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffe50,(Message *)&local_1c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffe50);
    if (local_1c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1c8._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      in_stack_fffffffffffffe48.object !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffe48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe48.object);
  }
  graph::Chimera<double>::J(&local_1a0,0,0,3,IN_0or4);
  testing::internal::DoubleNearPredFormat
            (expr1,(char *)0x13cfcb,(char *)abs_error_expr,(double)in_stack_fffffffffffffe50.data_,
             in_stack_fffffffffffffe48.number_float,
             (double)CONCAT71(in_stack_fffffffffffffe41,in_stack_fffffffffffffe40.m_isRValue));
  if (in_stack_fffffffffffffe40.m_isRValue == false) {
    testing::Message::Message((Message *)&local_1c8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        in_stack_fffffffffffffe48.object ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      puVar1 = "";
    }
    else {
      puVar1 = ((in_stack_fffffffffffffe48.binary)->
               super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffe50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/quadratic.hpp"
               ,0xd8,(char *)puVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffe50,(Message *)&local_1c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffe50);
    if (local_1c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1c8._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      in_stack_fffffffffffffe48.object !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffe48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe48.object);
  }
  graph::Chimera<double>::J(&local_1a0,0,1,5,MINUS_C);
  testing::internal::DoubleNearPredFormat
            (expr1,(char *)0x13d099,(char *)abs_error_expr,(double)in_stack_fffffffffffffe50.data_,
             in_stack_fffffffffffffe48.number_float,
             (double)CONCAT71(in_stack_fffffffffffffe41,in_stack_fffffffffffffe40.m_isRValue));
  if (in_stack_fffffffffffffe40.m_isRValue == false) {
    testing::Message::Message((Message *)&local_1c8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        in_stack_fffffffffffffe48.object ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      puVar1 = "";
    }
    else {
      puVar1 = ((in_stack_fffffffffffffe48.binary)->
               super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffe50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/quadratic.hpp"
               ,0xd9,(char *)puVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffe50,(Message *)&local_1c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffe50);
    if (local_1c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1c8._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      in_stack_fffffffffffffe48.object !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffe48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe48.object);
  }
  graph::Chimera<double>::h(&local_1a0,0,1,3);
  testing::internal::DoubleNearPredFormat
            (expr1,(char *)0x13d161,(char *)abs_error_expr,(double)in_stack_fffffffffffffe50.data_,
             in_stack_fffffffffffffe48.number_float,
             (double)CONCAT71(in_stack_fffffffffffffe41,in_stack_fffffffffffffe40.m_isRValue));
  if (in_stack_fffffffffffffe40.m_isRValue == false) {
    testing::Message::Message((Message *)&local_1c8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        in_stack_fffffffffffffe48.object ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      puVar1 = "";
    }
    else {
      puVar1 = ((in_stack_fffffffffffffe48.binary)->
               super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffe50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/quadratic.hpp"
               ,0xda,(char *)puVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffe50,(Message *)&local_1c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffe50);
    if (local_1c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1c8._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      in_stack_fffffffffffffe48.object !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffe48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe48.object);
  }
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&local_1a0.super_Sparse<double>._list_adj_nodes);
  std::
  _Hashtable<std::pair<unsigned_long,_unsigned_long>,_std::pair<const_std::pair<unsigned_long,_unsigned_long>,_double>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_long,_unsigned_long>_>,_openjij::utility::PairHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_1a0.super_Sparse<double>._J._M_h);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_b8._label_to_idx._M_h);
  if (local_b8._idx_to_label.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8._idx_to_label.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b8._idx_to_label.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8._idx_to_label.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  free(local_b8._quadmat.m_outerIndex);
  free(local_b8._quadmat.m_innerNonZeros);
  Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage(&local_b8._quadmat.m_data);
  std::
  _Hashtable<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_128);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_f0);
  return;
}

Assistant:

TEST(Graph, JSONTest){
    using namespace cimod;
    using namespace openjij;

    Linear<uint32_t, double> linear{ {0, 1.0}, {11, 3.0}};
    Quadratic<uint32_t, double> quadratic
    {
        {std::make_pair(0, 4), 12.0}, {std::make_pair(4, 12), 13.0}, {std::make_pair(6, 14), 14.0},
            {std::make_pair(3, 4), 23.0}, {std::make_pair(11, 12), 24.0},
            {std::make_pair(5, 13), 34.0}
    };
    double offset = 0.0;
    Vartype vartype = Vartype::SPIN;
    BinaryQuadraticModel<uint32_t, double, cimod::Sparse> bqm_k4(linear, quadratic, offset, vartype);
    auto s = graph::Chimera<double>(bqm_k4.to_serializable(), 1, 2);
    EXPECT_NEAR(s.J(0,1,3,graph::ChimeraDir::IN_0or4), 24, 1e-5);
    EXPECT_NEAR(s.J(0,0,4,graph::ChimeraDir::PLUS_C), 13, 1e-5);
    EXPECT_NEAR(s.J(0,1,6,graph::ChimeraDir::MINUS_C), 14, 1e-5);
    EXPECT_NEAR(s.J(0,0,4,graph::ChimeraDir::IN_3or7), 23, 1e-5);
    EXPECT_NEAR(s.J(0,0,3,graph::ChimeraDir::IN_0or4), 23, 1e-5);
    EXPECT_NEAR(s.J(0,1,5,graph::ChimeraDir::MINUS_C), 34, 1e-5);
    EXPECT_NEAR(s.h(0,1,3), 3, 1e-5);
}